

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::Pattern::~Pattern(Pattern *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Pattern_00241500;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

TestSpec::Pattern::~Pattern() = default;